

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O2

void boost::detail::function::
     functor_manager<boost::_bi::bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>_>
     ::manage(function_buffer *in_buffer,function_buffer *out_buffer,
             functor_manager_operation_type op)

{
  undefined8 *puVar1;
  long lVar2;
  void *pvVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 *puVar6;
  pointer_____offset_0x10___ *ppuStack_18;
  
  if (op == get_functor_type_tag) {
    *(pointer_____offset_0x10___ **)out_buffer =
         &_bi::
          bind_t<void,boost::_mfi::mf0<void,boost::unit_test::test_unit_fixture>,boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>>>>
          ::typeinfo;
    *(char *)((long)out_buffer + 8) = '\0';
    *(char *)((long)out_buffer + 9) = '\0';
    return;
  }
  switch(op) {
  case clone_functor_tag:
    puVar1 = *(undefined8 **)in_buffer;
    puVar6 = (undefined8 *)operator_new(0x20);
    uVar4 = puVar1[1];
    *puVar6 = *puVar1;
    puVar6[1] = uVar4;
    puVar6[2] = puVar1[2];
    lVar2 = puVar1[3];
    puVar6[3] = lVar2;
    if (lVar2 != 0) {
      LOCK();
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      UNLOCK();
    }
    goto LAB_00197a86;
  case move_functor_tag:
    *(undefined8 *)out_buffer = *(undefined8 *)in_buffer;
    *(undefined8 *)in_buffer = 0;
    break;
  case destroy_functor_tag:
    pvVar3 = *(void **)out_buffer;
    if (pvVar3 != (void *)0x0) {
      shared_count::~shared_count((shared_count *)((long)pvVar3 + 0x18));
    }
    operator_delete(pvVar3,0x20);
LAB_00197a8b:
    *(undefined8 *)out_buffer = 0;
    break;
  case check_functor_type_tag:
    ppuStack_18 = &_bi::
                   bind_t<void,boost::_mfi::mf0<void,boost::unit_test::test_unit_fixture>,boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>>>>
                   ::typeinfo;
    bVar5 = typeindex::operator==
                      (*(type_info **)out_buffer,
                       (type_index_facade<boost::typeindex::stl_type_index,_std::type_info> *)
                       &ppuStack_18);
    if (!bVar5) goto LAB_00197a8b;
    puVar6 = *(undefined8 **)in_buffer;
LAB_00197a86:
    *(undefined8 **)out_buffer = puVar6;
    break;
  default:
    *(pointer_____offset_0x10___ **)out_buffer =
         &_bi::
          bind_t<void,boost::_mfi::mf0<void,boost::unit_test::test_unit_fixture>,boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>>>>
          ::typeinfo;
    *(char *)((long)out_buffer + 8) = '\0';
    *(char *)((long)out_buffer + 9) = '\0';
  }
  return;
}

Assistant:

static inline void
        manage(const function_buffer& in_buffer, function_buffer& out_buffer,
               functor_manager_operation_type op)
        {
          typedef typename get_function_tag<functor_type>::type tag_type;
          switch (op) {
          case get_functor_type_tag:
            out_buffer.members.type.type = &boost::typeindex::type_id<functor_type>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
            return;

          default:
            manager(in_buffer, out_buffer, op, tag_type());
            return;
          }
        }